

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O1

void ASN1_put_object(uchar **pp,int constructed,int length,int tag,int xclass)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  pbVar2 = *pp;
  bVar1 = (byte)xclass & 0xc0 | (constructed != 0) << 5;
  if (tag < 0x1f) {
    *pbVar2 = bVar1 | (byte)tag & 0x1f;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = bVar1 | 0x1f;
    lVar3 = 0;
    uVar5 = tag;
    do {
      lVar4 = lVar3;
      lVar3 = lVar4 + 1;
      bVar8 = 0x7f < uVar5;
      uVar5 = uVar5 >> 7;
    } while (bVar8);
    iVar6 = 0;
    do {
      pbVar2[lVar3] = (iVar6 != 0) << 7 | (byte)tag & 0x7f;
      tag = (uint)tag >> 7;
      iVar6 = iVar6 + 1;
      lVar7 = lVar3 + -1;
      bVar8 = 0 < lVar3;
      lVar3 = lVar7;
    } while (lVar7 != 0 && bVar8);
    pbVar2 = pbVar2 + lVar4 + 2;
  }
  if (constructed == 2) {
    *pbVar2 = 0x80;
  }
  else {
    if (0x7f < length) {
      lVar3 = 1;
      uVar5 = length;
      do {
        lVar4 = lVar3;
        lVar3 = lVar4 + 1;
        bVar8 = 0xff < uVar5;
        uVar5 = uVar5 >> 8;
      } while (bVar8);
      *pbVar2 = (byte)lVar4 | 0x80;
      lVar4 = lVar3;
      do {
        pbVar2[lVar4 + -1] = (byte)length;
        length = (uint)length >> 8;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
      pbVar2 = pbVar2 + lVar3;
      goto LAB_00207df6;
    }
    *pbVar2 = (byte)length;
  }
  pbVar2 = pbVar2 + 1;
LAB_00207df6:
  *pp = pbVar2;
  return;
}

Assistant:

void ASN1_put_object(unsigned char **pp, int constructed, int length, int tag,
                     int xclass) {
  unsigned char *p = *pp;
  int i, ttag;

  i = (constructed) ? V_ASN1_CONSTRUCTED : 0;
  i |= (xclass & V_ASN1_PRIVATE);
  if (tag < 31) {
    *(p++) = i | (tag & V_ASN1_PRIMITIVE_TAG);
  } else {
    *(p++) = i | V_ASN1_PRIMITIVE_TAG;
    for (i = 0, ttag = tag; ttag > 0; i++) {
      ttag >>= 7;
    }
    ttag = i;
    while (i-- > 0) {
      p[i] = tag & 0x7f;
      if (i != (ttag - 1)) {
        p[i] |= 0x80;
      }
      tag >>= 7;
    }
    p += ttag;
  }
  if (constructed == 2) {
    *(p++) = 0x80;
  } else {
    asn1_put_length(&p, length);
  }
  *pp = p;
}